

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mulxy(TCGContext_conflict1 *tcg_ctx,TCGv_i32 t0,TCGv_i32 t1,int x,int y)

{
  int y_local;
  int x_local;
  TCGv_i32 t1_local;
  TCGv_i32 t0_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (x == 0) {
    tcg_gen_ext16s_i32_aarch64(tcg_ctx,t0,t0);
  }
  else {
    tcg_gen_sari_i32_aarch64(tcg_ctx,t0,t0,0x10);
  }
  if (y == 0) {
    tcg_gen_ext16s_i32_aarch64(tcg_ctx,t1,t1);
  }
  else {
    tcg_gen_sari_i32_aarch64(tcg_ctx,t1,t1,0x10);
  }
  tcg_gen_mul_i32(tcg_ctx,t0,t0,t1);
  return;
}

Assistant:

static inline void gen_mulxy(TCGContext *tcg_ctx, TCGv_i32 t0, TCGv_i32 t1, int x, int y)
{
    if (x)
        tcg_gen_sari_i32(tcg_ctx, t0, t0, 16);
    else
        gen_sxth(t0);
    if (y)
        tcg_gen_sari_i32(tcg_ctx, t1, t1, 16);
    else
        gen_sxth(t1);
    tcg_gen_mul_i32(tcg_ctx, t0, t0, t1);
}